

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ticket-translation.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  int *piVar3;
  basic_ifstream<char,_std::char_traits<char>_> *file_00;
  size_type sVar4;
  reference this;
  size_type sVar5;
  reference pvVar6;
  ulong local_348;
  size_t i;
  uint64_t a2;
  undefined1 local_2f0 [8];
  puzzle solved;
  uint64_t a1;
  puzzle puzzle;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  basic_ifstream<char,_std::char_traits<char>_> *input;
  undefined1 local_228 [8];
  variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> file;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  file.super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>.
  super__Move_assign_alias<int,_std::basic_ifstream<char>_>.
  super__Copy_assign_alias<int,_std::basic_ifstream<char>_>.
  super__Move_ctor_alias<int,_std::basic_ifstream<char>_>.
  super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>.
  super__Variant_storage_alias<int,_std::basic_ifstream<char>_>._520_8_ = argv;
  if (argc == 2) {
    get_input((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)local_228,2,argv)
    ;
    bVar1 = std::holds_alternative<int,int,std::ifstream>
                      ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                       local_228);
    if (bVar1) {
      piVar3 = std::get<int,int,std::ifstream>
                         ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                          local_228);
      argv_local._4_4_ = *piVar3;
    }
    else {
      file_00 = std::get<std::ifstream,int,std::ifstream>
                          ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                           local_228);
      tokenize_abi_cxx11_<std::ifstream>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&puzzle.tickets.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,file_00);
      read_input((puzzle *)&a1,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&puzzle.tickets.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      solved.tickets.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)ticket_scanning_error_rate((puzzle *)&a1);
      poVar2 = std::operator<<((ostream *)&std::cout,"Part 1: ");
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,(ulong)solved.tickets.
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar2,"\n");
      ::puzzle::puzzle((puzzle *)&a2,(puzzle *)&a1);
      resolve_field_order((puzzle *)local_2f0,(puzzle *)&a2);
      ::puzzle::~puzzle((puzzle *)&a2);
      i = 1;
      local_348 = 0;
      while( true ) {
        sVar4 = std::vector<puzzle::field,_std::allocator<puzzle::field>_>::size
                          ((vector<puzzle::field,_std::allocator<puzzle::field>_> *)local_2f0);
        if (sVar4 <= local_348) break;
        this = std::vector<puzzle::field,_std::allocator<puzzle::field>_>::operator[]
                         ((vector<puzzle::field,_std::allocator<puzzle::field>_> *)local_2f0,
                          local_348);
        sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(&this->name,"departure",0);
        if (sVar5 == 0) {
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &solved.fields.
                               super__Vector_base<puzzle::field,_std::allocator<puzzle::field>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,local_348);
          i = *pvVar6 * i;
        }
        local_348 = local_348 + 1;
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"Part 2: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,i);
      std::operator<<(poVar2,"\n");
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          (ulong)solved.tickets.
                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar2 = std::operator<<(poVar2,"\n");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,i);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      ::puzzle::~puzzle((puzzle *)local_2f0);
      ::puzzle::~puzzle((puzzle *)&a1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&puzzle.tickets.
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::~variant
              ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)local_228);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar2 = std::operator<<(poVar2,*(char **)file.
                                              super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>
                                              .
                                              super__Move_assign_alias<int,_std::basic_ifstream<char>_>
                                              .
                                              super__Copy_assign_alias<int,_std::basic_ifstream<char>_>
                                              .
                                              super__Move_ctor_alias<int,_std::basic_ifstream<char>_>
                                              .
                                              super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>
                                              .
                                              super__Variant_storage_alias<int,_std::basic_ifstream<char>_>
                                              ._520_8_);
    poVar2 = std::operator<<(poVar2," {path-to-file}");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  if (argc != 2) {
    std::cout << "Usage: " << argv[0] << " {path-to-file}" << std::endl;
    return 1;
  }

  auto file = get_input(argc, argv);

  if (std::holds_alternative<int>(file))
    return std::get<int>(file);

  auto& input = std::get<std::ifstream>(file);

  auto tokens = tokenize(input);

  auto puzzle = read_input(tokens);

  auto a1 = ticket_scanning_error_rate(puzzle);
  std::cout << "Part 1: " << a1 << "\n";

  auto solved = resolve_field_order(puzzle);
  auto a2 = uint64_t {1};
  for (size_t i = 0; i < solved.fields.size(); i++) {
    if (solved.fields[i].name.find("departure") == 0) {
      a2 *= solved.mine[i];
    }
  }

  std::cout << "Part 2: " << a2 << "\n";
  std::cout << a1 << "\n" << a2 << std::endl;
}